

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lhaptic.c
# Opt level: O2

_Bool lhap_effect2lin(ff_effect *lin,ALLEGRO_HAPTIC_EFFECT *al)

{
  int iVar1;
  undefined1 uVar2;
  ushort uVar3;
  double dVar4;
  
  *(undefined8 *)&(lin->u).periodic.envelope.fade_level = 0;
  (lin->u).periodic.custom_data = (__s16 *)0x0;
  *(undefined8 *)&lin->u = 0;
  *(undefined8 *)&(lin->u).constant.envelope.fade_level = 0;
  lin->type = 0;
  lin->id = 0;
  lin->direction = 0;
  (lin->trigger).button = 0;
  *(undefined8 *)&(lin->trigger).interval = 0;
  iVar1 = al->type;
  switch(iVar1) {
  case 1:
    uVar3 = 0x50;
    break;
  case 2:
    uVar3 = 0x51;
    break;
  case 3:
  case 5:
  case 6:
  case 7:
    goto switchD_0018ba2f_caseD_3;
  case 4:
    uVar3 = 0x52;
    break;
  case 8:
    uVar3 = 0x53;
    break;
  default:
    if (iVar1 == 0x10) {
      uVar3 = 0x54;
    }
    else if (iVar1 == 0x20) {
      uVar3 = 0x55;
    }
    else if (iVar1 == 0x40) {
      uVar3 = 0x56;
    }
    else {
      if (iVar1 != 0x80) {
        return false;
      }
      uVar3 = 0x57;
    }
  }
  lin->type = uVar3;
  dVar4 = round(((al->direction).angle * 49152.0) / 6.283185307179586);
  lin->direction = (__u16)(int)dVar4;
  lin->id = -1;
  dVar4 = (al->replay).delay;
  if ((0.0 <= dVar4) && (dVar4 <= 32.767)) {
    dVar4 = round(dVar4 * 1000.0);
    (lin->replay).delay = (__u16)(int)dVar4;
    dVar4 = (al->replay).length;
    if ((0.0 <= dVar4) && (dVar4 <= 32.767)) {
      dVar4 = round(dVar4 * 1000.0);
      (lin->replay).length = (__u16)(int)dVar4;
      uVar2 = (*(code *)(&DAT_001ae530 + *(int *)(&DAT_001ae530 + (ulong)(uVar3 - 0x50) * 4)))();
      return (_Bool)uVar2;
    }
  }
switchD_0018ba2f_caseD_3:
  return false;
}

Assistant:

static bool lhap_effect2lin(struct ff_effect *lin, ALLEGRO_HAPTIC_EFFECT *al)
{
   memset(lin, 0, sizeof(*lin));

   if (!lhap_type2lin(&lin->type, al->type))
      return false;
   /* lin_effect->replay = effect->re; */
   lin->direction = (__u16)
      round(((double)0xC000 * al->direction.angle) / (2 * M_PI));
   lin->id = -1;
   if (!lhap_replay2lin(&lin->replay, &al->replay))
      return false;
   switch (lin->type) {
      case FF_RUMBLE:
         return lhap_rumble2lin(&lin->u.rumble, &al->data.rumble);
      case FF_PERIODIC:
         return lhap_periodic2lin(&lin->u.periodic, &al->data.periodic);
      case FF_CONSTANT:
         return lhap_constant2lin(&lin->u.constant, &al->data.constant);
      case FF_RAMP:
         return lhap_ramp2lin(&lin->u.ramp, &al->data.ramp);
      case FF_SPRING:   /* fall through */
      case FF_FRICTION: /* fall through */
      case FF_DAMPER:   /* fall through */
      case FF_INERTIA:
         return lhap_condition2lin(&lin->u.condition[0], &al->data.condition);
      default:
         return false;
   }
}